

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool list_exec(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_fiber_t *pgVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_value_t *__ptr;
  char *pcVar3;
  undefined6 in_register_00000012;
  uint32_t n;
  char *pcVar4;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  char local_1028 [4096];
  
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) && (args[1].isa == gravity_class_int)) {
    n = *(uint32_t *)&args[1].field_1;
    aVar2.p = (gravity_object_t *)gravity_list_new(vm,n);
    if ((gravity_list_t *)aVar2.n != (gravity_list_t *)0x0) {
      for (; n != 0; n = n - 1) {
        pcVar3 = (char *)((gravity_value_r *)&(aVar2.p)->objclass)->n;
        __ptr = *(gravity_value_t **)&(aVar2.p)->has_outer;
        if (pcVar3 == (aVar2.p)->identifier) {
          pcVar4 = (char *)((long)pcVar3 * 2);
          if (pcVar3 == (char *)0x0) {
            pcVar4 = (char *)0x8;
          }
          (aVar2.p)->identifier = pcVar4;
          __ptr = (gravity_value_t *)realloc(__ptr,(long)pcVar4 << 4);
          *(gravity_value_t **)&(aVar2.p)->has_outer = __ptr;
          pcVar3 = (char *)((gravity_value_r *)&(aVar2.p)->objclass)->n;
        }
        ((gravity_value_r *)&(aVar2.p)->objclass)->n = (size_t)(pcVar3 + 1);
        __ptr[(long)pcVar3].isa = gravity_class_null;
        __ptr[(long)pcVar3].field_1.n = 0;
      }
      value_00.field_1.p = (gravity_object_t *)aVar2.n;
      value_00.isa = (aVar2.p)->isa;
      gravity_vm_setslot(vm,value_00,rindex);
      return true;
    }
    snprintf(local_1028,0x1000,"Maximum List allocation size reached (%d).",0x400000);
    pgVar1 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar1,local_1028);
  }
  else {
    builtin_strncpy(local_1028,"An Int value is expected as argument of list_exec.",0x33);
    pgVar1 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar1,local_1028);
  }
  value.field_1.n = 0;
  value.isa = gravity_class_null;
  gravity_vm_setslot(vm,value,rindex);
  return false;
}

Assistant:

static bool list_exec (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if ((nargs != 2) || (!VALUE_ISA_INT(GET_VALUE(1)))) RETURN_ERROR("An Int value is expected as argument of list_exec.");

    uint32_t n = (uint32_t)VALUE_AS_INT(GET_VALUE(1));
    gravity_list_t *list = gravity_list_new(vm, n);
    if (!list) RETURN_ERROR("Maximum List allocation size reached (%d).", MAX_ALLOCATION);

    for (uint32_t i=0; i<n; ++i) {
        marray_push(gravity_value_t, list->array, VALUE_FROM_NULL);
    }

    RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
}